

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

string * join(string *separator,vector<int,_std::allocator<int>_> *items)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<int,_std::allocator<int>_> *in_RDX;
  uint local_1b4;
  uint i;
  size_type size;
  stringstream s;
  ostream local_198 [376];
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *items_local;
  string *separator_local;
  
  local_20 = in_RDX;
  items_local = items;
  separator_local = separator;
  std::__cxx11::stringstream::stringstream((stringstream *)&size);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(local_20);
  for (local_1b4 = 0; local_1b4 < sVar1; local_1b4 = local_1b4 + 1) {
    if (local_1b4 != 0) {
      std::operator<<(local_198,(string *)items_local);
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(ulong)local_1b4);
    std::ostream::operator<<(local_198,*pvVar2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&size);
  return separator;
}

Assistant:

std::string join (
  const std::string& separator,
  const std::vector<int>& items)
{
  std::stringstream s;
  auto size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    if (i)
      s << separator;

    s << items[i];
  }

  return s.str ();
}